

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-workload-benchmark.cpp
# Opt level: O0

void workload_unrollaccum8(vector<float,_std::allocator<float>_> *data,float *result)

{
  int iVar1;
  size_type sVar2;
  ostream *poVar3;
  duration dVar4;
  const_reference pvVar5;
  rep rVar6;
  duration<long,_std::ratio<1L,_1000000000L>_> local_78;
  duration<double,_std::ratio<1L,_1000L>_> local_70 [3];
  lock_guard<std::mutex> local_58;
  lock_guard<std::mutex> iolock;
  time_point t2;
  size_t i;
  float rt7;
  float rt6;
  float rt5;
  float rt4;
  float rt3;
  float rt2;
  float rt1;
  float rt0;
  time_point t1;
  float *result_local;
  vector<float,_std::allocator<float>_> *data_local;
  
  t1.__d.__r = (duration)(duration)result;
  _rt1 = (duration)std::chrono::_V2::system_clock::now();
  sVar2 = std::vector<float,_std::allocator<float>_>::size(data);
  if ((sVar2 & 7) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR in ");
    poVar3 = std::operator<<(poVar3,"workload_unrollaccum8");
    poVar3 = std::operator<<(poVar3,": data.size ");
    sVar2 = std::vector<float,_std::allocator<float>_>::size(data);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
    std::operator<<(poVar3,"\n");
  }
  rt2 = 0.0;
  rt3 = 0.0;
  rt4 = 0.0;
  rt5 = 0.0;
  rt6 = 0.0;
  rt7 = 0.0;
  i._4_4_ = 0.0;
  i._0_4_ = 0.0;
  t2.__d.__r = (duration)0;
  while( true ) {
    dVar4.__r = std::vector<float,_std::allocator<float>_>::size(data);
    if ((ulong)dVar4.__r <= (ulong)t2.__d.__r) break;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](data,(size_type)t2.__d.__r);
    rt2 = *pvVar5 + rt2;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](data,(long)t2.__d.__r + 1);
    rt3 = *pvVar5 + rt3;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](data,(long)t2.__d.__r + 2);
    rt4 = *pvVar5 + rt4;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](data,(long)t2.__d.__r + 3);
    rt5 = *pvVar5 + rt5;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](data,(long)t2.__d.__r + 4);
    rt6 = *pvVar5 + rt6;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](data,(long)t2.__d.__r + 5);
    rt7 = *pvVar5 + rt7;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](data,(long)t2.__d.__r + 6);
    i._4_4_ = *pvVar5 + i._4_4_;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](data,(long)t2.__d.__r + 7);
    i._0_4_ = *pvVar5 + (float)i;
    t2.__d.__r = (duration)((long)t2.__d.__r + 8);
  }
  *(float *)t1.__d.__r = rt2 + rt3 + rt4 + rt5 + rt6 + rt7 + i._4_4_ + (float)i;
  iolock._M_device = (mutex_type *)std::chrono::_V2::system_clock::now();
  std::lock_guard<std::mutex>::lock_guard(&local_58,&iomutex);
  poVar3 = std::operator<<((ostream *)&std::cout,"workload_unrollaccum8");
  poVar3 = std::operator<<(poVar3," [cpu ");
  iVar1 = sched_getcpu();
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  std::operator<<(poVar3,"]:\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"  processed items: ");
  sVar2 = std::vector<float,_std::allocator<float>_>::size(data);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"  elapsed: ");
  local_78.__r = (rep_conflict)
                 std::chrono::operator-
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&iolock,
                            (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&rt1);
  std::chrono::duration<double,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1000l>> *)local_70,&local_78);
  rVar6 = std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(local_70);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar6);
  std::operator<<(poVar3," ms\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"  result: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(float *)t1.__d.__r);
  std::operator<<(poVar3,"\n");
  std::lock_guard<std::mutex>::~lock_guard(&local_58);
  return;
}

Assistant:

void workload_unrollaccum8(const std::vector<float>& data, float& result) {
  auto t1 = hires_clock::now();
  if (data.size() % 8 != 0) {
    std::cerr
        << "ERROR in " << __func__ << ": data.size " << data.size() << "\n";
  }
  float rt0 = 0;
  float rt1 = 0;
  float rt2 = 0;
  float rt3 = 0;
  float rt4 = 0;
  float rt5 = 0;
  float rt6 = 0;
  float rt7 = 0;
  for (size_t i = 0; i < data.size(); i += 8) {
    rt0 += data[i];
    rt1 += data[i + 1];
    rt2 += data[i + 2];
    rt3 += data[i + 3];
    rt4 += data[i + 4];
    rt5 += data[i + 5];
    rt6 += data[i + 6];
    rt7 += data[i + 7];
  }
  result = rt0 + rt1 + rt2 + rt3 + rt4 + rt5 + rt6 + rt7;

  {
    auto t2 = hires_clock::now();
    std::lock_guard<std::mutex> iolock(iomutex);
    std::cout << __func__ << " [cpu " << sched_getcpu() << "]:\n";
    std::cout << "  processed items: " << data.size() << "\n";
    std::cout << "  elapsed: " << duration_ms(t2 - t1).count() << " ms\n";
    std::cout << "  result: " << result << "\n";
  }
}